

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-crit.cpp
# Opt level: O3

vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_> *
getSlicingCriteriaInstructions
          (vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_> *__return_storage_ptr__,
          Module *M,string *slicingCriteria,bool criteria_are_next_instr,LLVMPointerAnalysis *pta,
          bool constructed_only)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  pointer pSVar3;
  pointer pbVar4;
  pointer pbVar5;
  raw_ostream *prVar6;
  raw_ostream *prVar7;
  _Base_ptr p_Var8;
  char *pcVar9;
  _Rb_tree_node_base *p_Var10;
  vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_> *extraout_RAX;
  _Rb_tree<llvm::Value_const*,llvm::Value_const*,std::_Identity<llvm::Value_const*>,std::less<llvm::Value_const*>,std::allocator<llvm::Value_const*>>
  *this;
  pointer pSVar11;
  ulong uVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *crit;
  string *opt;
  vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_> *__range2;
  bool bVar13;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Str_04;
  StringRef Str_05;
  StringRef Str_06;
  StringRef Str_07;
  StringRef Str_08;
  StringRef Str_09;
  StringRef Str_10;
  StringRef Str_11;
  StringRef Str_12;
  StringRef Str_13;
  StringRef Str_14;
  StringRef Str_15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  primsec;
  set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
  *__range3;
  set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
  newset;
  set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
  secondaryToAll;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  criteria;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  Module *local_d0;
  LLVMPointerAnalysis *local_c8;
  pointer local_c0;
  string *local_b8;
  Value *local_b0;
  _Rb_tree<const_llvm::Value_*,_const_llvm::Value_*,_std::_Identity<const_llvm::Value_*>,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
  local_a8;
  _Rb_tree<const_llvm::Value_*,_const_llvm::Value_*,_std::_Identity<const_llvm::Value_*>,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_d0 = M;
  local_c8 = pta;
  splitList(&local_48,slicingCriteria,';');
  (__return_storage_ptr__->
  super__Vector_base<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_78._M_impl.super__Rb_tree_header._M_header;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  opt = local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  local_78._M_impl.super__Rb_tree_header._M_header._M_right =
       local_78._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if (opt->_M_string_length != 0) {
        std::vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>::emplace_back<>
                  (__return_storage_ptr__);
        splitList(&local_e8,opt,'|');
        if (0x40 < (ulong)((long)local_e8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_e8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)) {
          prVar6 = (raw_ostream *)llvm::errs();
          Str.Length = 0x37;
          Str.Data = "WARNING: Only one | in SC supported, ignoring the rest\n";
          llvm::raw_ostream::operator<<(prVar6,Str);
        }
        pbVar5 = local_e8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar4 = local_e8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pSVar11 = (__return_storage_ptr__->
                  super__Vector_base<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        local_c0 = pSVar11 + -1;
        bVar13 = (local_e8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_string_length == 0;
        if (!bVar13) {
          getCriteriaInstructions
                    (local_d0,local_c8,
                     local_e8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,&local_c0->primary,constructed_only);
        }
        bVar13 = bVar13 && 0x20 < (ulong)((long)pbVar5 - (long)pbVar4);
        if (pSVar11[-1].primary._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          prVar6 = (raw_ostream *)llvm::errs();
          Str_00.Length = 0xd;
          Str_00.Data = "SC: Matched \'";
          prVar6 = llvm::raw_ostream::operator<<(prVar6,Str_00);
          prVar6 = (raw_ostream *)
                   llvm::raw_ostream::write
                             ((char *)prVar6,
                              (ulong)((local_e8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             );
          Str_01.Length = 7;
          Str_01.Data = "\' to: \n";
          llvm::raw_ostream::operator<<(prVar6,Str_01);
          p_Var8 = pSVar11[-1].primary._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var1 = &pSVar11[-1].primary._M_t._M_impl.super__Rb_tree_header;
          uVar12 = 0;
          if ((_Rb_tree_header *)p_Var8 == p_Var1) {
LAB_00124bd6:
            prVar6 = (raw_ostream *)llvm::errs();
            Str_04.Length = 10;
            Str_04.Data = " ... and  ";
            prVar6 = llvm::raw_ostream::operator<<(prVar6,Str_04);
            prVar6 = (raw_ostream *)
                     llvm::raw_ostream::operator<<
                               (prVar6,(pSVar11[-1].primary._M_t._M_impl.super__Rb_tree_header.
                                        _M_node_count - uVar12) + 1);
            Str_05.Length = 6;
            Str_05.Data = " more\n";
            llvm::raw_ostream::operator<<(prVar6,Str_05);
          }
          else {
            do {
              if (uVar12 == 10) {
                uVar12 = 0xb;
                break;
              }
              uVar12 = uVar12 + 1;
              prVar6 = *(raw_ostream **)(p_Var8 + 1);
              prVar7 = (raw_ostream *)llvm::errs();
              Str_02.Length = 2;
              Str_02.Data = "  ";
              prVar7 = llvm::raw_ostream::operator<<(prVar7,Str_02);
              llvm::Value::print(prVar6,SUB81(prVar7,0));
              Str_03.Length = 1;
              Str_03.Data = "\n";
              llvm::raw_ostream::operator<<(prVar7,Str_03);
              p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
            } while ((_Rb_tree_header *)p_Var8 != p_Var1);
            if (uVar12 <= pSVar11[-1].primary._M_t._M_impl.super__Rb_tree_header._M_node_count)
            goto LAB_00124bd6;
          }
          if (criteria_are_next_instr) {
            local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_a8._M_impl.super__Rb_tree_header._M_header;
            local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
            for (p_Var10 = pSVar11[-1].primary._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var10 != p_Var1;
                p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
              prVar6 = *(raw_ostream **)(p_Var10 + 1);
              if (((prVar6 == (raw_ostream *)0x0) || ((byte)prVar6[0x10] < 0x1b)) ||
                 (lVar2 = *(long *)(prVar6 + 0x20),
                 lVar2 == *(long *)(prVar6 + 0x28) + 0x28 || lVar2 == 0)) {
                pcVar9 = (char *)llvm::errs();
                if ((ulong)(*(long *)(pcVar9 + 0x18) - (long)*(char **)(pcVar9 + 0x20)) < 0x26) {
                  pcVar9 = (char *)llvm::raw_ostream::write(pcVar9,0x12c75f);
                }
                else {
                  builtin_strncpy(*(char **)(pcVar9 + 0x20),"WARNING: unable to get next instr for "
                                  ,0x26);
                  *(long *)(pcVar9 + 0x20) = *(long *)(pcVar9 + 0x20) + 0x26;
                }
                llvm::Value::print(prVar6,SUB81(pcVar9,0));
                if (*(undefined1 **)(pcVar9 + 0x18) == *(undefined1 **)(pcVar9 + 0x20)) {
                  llvm::raw_ostream::write(pcVar9,0x12c650);
                }
                else {
                  **(undefined1 **)(pcVar9 + 0x20) = 10;
                  *(long *)(pcVar9 + 0x20) = *(long *)(pcVar9 + 0x20) + 1;
                }
              }
              else {
                local_b0 = (Value *)(lVar2 + -0x18);
                std::
                _Rb_tree<llvm::Value_const*,llvm::Value_const*,std::_Identity<llvm::Value_const*>,std::less<llvm::Value_const*>,std::allocator<llvm::Value_const*>>
                ::_M_insert_unique<llvm::Value_const*>
                          ((_Rb_tree<llvm::Value_const*,llvm::Value_const*,std::_Identity<llvm::Value_const*>,std::less<llvm::Value_const*>,std::allocator<llvm::Value_const*>>
                            *)&local_a8,&local_b0);
              }
            }
            std::
            _Rb_tree<const_llvm::Value_*,_const_llvm::Value_*,_std::_Identity<const_llvm::Value_*>,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
            ::swap((_Rb_tree<const_llvm::Value_*,_const_llvm::Value_*,_std::_Identity<const_llvm::Value_*>,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                    *)local_c0,&local_a8);
            p_Var10 = pSVar11[-1].primary._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            uVar12 = 0;
            if ((_Rb_tree_header *)p_Var10 == p_Var1) {
LAB_00124dd4:
              prVar6 = (raw_ostream *)llvm::errs();
              Str_08.Length = 10;
              Str_08.Data = " ... and  ";
              prVar6 = llvm::raw_ostream::operator<<(prVar6,Str_08);
              prVar6 = (raw_ostream *)
                       llvm::raw_ostream::operator<<
                                 (prVar6,(pSVar11[-1].primary._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count - uVar12) + 1);
              Str_09.Length = 6;
              Str_09.Data = " more\n";
              llvm::raw_ostream::operator<<(prVar6,Str_09);
            }
            else {
              do {
                if (uVar12 == 10) {
                  uVar12 = 0xb;
                  break;
                }
                uVar12 = uVar12 + 1;
                prVar6 = *(raw_ostream **)(p_Var10 + 1);
                prVar7 = (raw_ostream *)llvm::errs();
                Str_06.Length = 0xd;
                Str_06.Data = "  SC (next): ";
                prVar7 = llvm::raw_ostream::operator<<(prVar7,Str_06);
                llvm::Value::print(prVar6,SUB81(prVar7,0));
                Str_07.Length = 1;
                Str_07.Data = "\n";
                llvm::raw_ostream::operator<<(prVar7,Str_07);
                p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
              } while ((_Rb_tree_header *)p_Var10 != p_Var1);
              if (uVar12 <= pSVar11[-1].primary._M_t._M_impl.super__Rb_tree_header._M_node_count)
              goto LAB_00124dd4;
            }
            std::
            _Rb_tree<const_llvm::Value_*,_const_llvm::Value_*,_std::_Identity<const_llvm::Value_*>,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
            ::_M_erase(&local_a8,
                       (_Link_type)local_a8._M_impl.super__Rb_tree_header._M_header._M_parent);
          }
        }
        if ((!(bool)(~bVar13 &
                    pSVar11[-1].primary._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) &&
           (0x20 < (ulong)((long)local_e8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_e8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start))) {
          getCriteriaInstructions
                    (local_d0,local_c8,
                     local_e8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1,&pSVar11[-1].secondary,
                     constructed_only);
          if (pSVar11[-1].secondary._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            prVar6 = (raw_ostream *)llvm::errs();
            Str_10.Length = 0xd;
            Str_10.Data = "SC: Matched \'";
            prVar6 = llvm::raw_ostream::operator<<(prVar6,Str_10);
            prVar6 = (raw_ostream *)
                     llvm::raw_ostream::write
                               ((char *)prVar6,
                                (ulong)local_e8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p
                               );
            Str_11.Length = 0x13;
            Str_11.Data = "\' (secondary) to: \n";
            llvm::raw_ostream::operator<<(prVar6,Str_11);
            p_Var10 = pSVar11[-1].secondary._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            p_Var1 = &pSVar11[-1].secondary._M_t._M_impl.super__Rb_tree_header;
            uVar12 = 0;
            if ((_Rb_tree_header *)p_Var10 != p_Var1) {
              do {
                if (uVar12 == 10) {
                  uVar12 = 0xb;
                  break;
                }
                uVar12 = uVar12 + 1;
                prVar6 = *(raw_ostream **)(p_Var10 + 1);
                prVar7 = (raw_ostream *)llvm::errs();
                Str_12.Length = 2;
                Str_12.Data = "  ";
                prVar7 = llvm::raw_ostream::operator<<(prVar7,Str_12);
                llvm::Value::print(prVar6,SUB81(prVar7,0));
                Str_13.Length = 1;
                Str_13.Data = "\n";
                llvm::raw_ostream::operator<<(prVar7,Str_13);
                p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
              } while ((_Rb_tree_header *)p_Var10 != p_Var1);
              if (pSVar11[-1].secondary._M_t._M_impl.super__Rb_tree_header._M_node_count < uVar12)
              goto LAB_00124f92;
            }
            prVar6 = (raw_ostream *)llvm::errs();
            Str_14.Length = 10;
            Str_14.Data = " ... and  ";
            prVar6 = llvm::raw_ostream::operator<<(prVar6,Str_14);
            prVar6 = (raw_ostream *)
                     llvm::raw_ostream::operator<<
                               (prVar6,(pSVar11[-1].primary._M_t._M_impl.super__Rb_tree_header.
                                        _M_node_count - uVar12) + 1);
            Str_15.Length = 6;
            Str_15.Data = " more\n";
            llvm::raw_ostream::operator<<(prVar6,Str_15);
          }
LAB_00124f92:
          if (bVar13) {
            std::
            _Rb_tree<llvm::Value_const*,llvm::Value_const*,std::_Identity<llvm::Value_const*>,std::less<llvm::Value_const*>,std::allocator<llvm::Value_const*>>
            ::_M_insert_range_unique<std::_Rb_tree_const_iterator<llvm::Value_const*>>
                      ((_Rb_tree<llvm::Value_const*,llvm::Value_const*,std::_Identity<llvm::Value_const*>,std::less<llvm::Value_const*>,std::allocator<llvm::Value_const*>>
                        *)&local_78,
                       pSVar11[-1].secondary._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<const_llvm::Value_*>)
                       &pSVar11[-1].secondary._M_t._M_impl.super__Rb_tree_header);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_e8);
      }
      opt = opt + 1;
    } while (opt != local_b8);
    if (local_78._M_impl.super__Rb_tree_header._M_node_count != 0) {
      pSVar11 = (__return_storage_ptr__->
                super__Vector_base<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>)._M_impl
                .super__Vector_impl_data._M_start;
      pSVar3 = (__return_storage_ptr__->
               super__Vector_base<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pSVar11 != pSVar3) {
        this = (_Rb_tree<llvm::Value_const*,llvm::Value_const*,std::_Identity<llvm::Value_const*>,std::less<llvm::Value_const*>,std::allocator<llvm::Value_const*>>
                *)&pSVar11->secondary;
        do {
          if (*(long *)(this + -8) != 0) {
            std::
            _Rb_tree<llvm::Value_const*,llvm::Value_const*,std::_Identity<llvm::Value_const*>,std::less<llvm::Value_const*>,std::allocator<llvm::Value_const*>>
            ::_M_insert_range_unique<std::_Rb_tree_const_iterator<llvm::Value_const*>>
                      (this,(_Rb_tree_const_iterator<const_llvm::Value_*>)
                            local_78._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<const_llvm::Value_*>)
                       &local_78._M_impl.super__Rb_tree_header);
          }
          pSVar11 = (pointer)(this + 0x30);
          this = this + 0x60;
        } while (pSVar11 != pSVar3);
      }
    }
  }
  std::
  _Rb_tree<const_llvm::Value_*,_const_llvm::Value_*,_std::_Identity<const_llvm::Value_*>,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
  ::_M_erase(&local_78,(_Link_type)local_78._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return extraout_RAX;
}

Assistant:

static std::vector<SlicingCriteriaSet> getSlicingCriteriaInstructions(
        llvm::Module &M, const std::string &slicingCriteria,
        bool criteria_are_next_instr, LLVMPointerAnalysis *pta = nullptr,
        bool constructed_only = false) {
    std::vector<std::string> criteria = splitList(slicingCriteria, ';');
    assert(!criteria.empty() && "Did not get slicing criteria");

    std::vector<SlicingCriteriaSet> result;
    std::set<const llvm::Value *> secondaryToAll;

    // map the criteria to instructions
    for (const auto &crit : criteria) {
        if (crit.empty())
            continue;

        result.emplace_back();

        auto primsec = splitList(crit, '|');
        if (primsec.size() > 2) {
            llvm::errs() << "WARNING: Only one | in SC supported, ignoring the "
                            "rest\n";
        }
        assert(primsec.size() >= 1 && "Invalid criterium");
        auto &SC = result.back();
        // do we have some criterion of the form |X?
        // I.e., only secondary SC? It means that that should
        // be added to every primary SC
        bool ssctoall = primsec[0].empty() && primsec.size() > 1;
        if (!primsec[0].empty()) {
            getCriteriaInstructions(M, pta, primsec[0], SC.primary,
                                    constructed_only);
        }

        if (!SC.primary.empty()) {
            llvm::errs() << "SC: Matched '" << primsec[0] << "' to: \n";
            size_t n = 0;
            for (const auto *val : SC.primary) {
                if (++n > 10)
                    break;
                llvm::errs() << "  " << *val << "\n";
            }
            if (SC.primary.size() >= n) {
                llvm::errs() << " ... and  " << SC.primary.size() - n + 1
                             << " more\n";
            }

            if (criteria_are_next_instr) {
                // the given (primary) criteria are just markers for the
                // next instruction, so map the criteria to
                // the next instructions
                auto newset = mapToNextInstr(SC.primary);
                SC.primary.swap(newset);

                n = 0;
                for (const auto *val : SC.primary) {
                    if (++n > 10)
                        break;
                    llvm::errs() << "  SC (next): " << *val << "\n";
                }
                if (SC.primary.size() >= n) {
                    llvm::errs() << " ... and  " << SC.primary.size() - n + 1
                                 << " more\n";
                }
            }
        }

        if ((!SC.primary.empty() || ssctoall) && primsec.size() > 1) {
            getCriteriaInstructions(M, pta, primsec[1], SC.secondary,
                                    constructed_only);

            if (!SC.secondary.empty()) {
                size_t n = 0;
                llvm::errs() << "SC: Matched '" << primsec[1]
                             << "' (secondary) to: \n";
                for (const auto *val : SC.secondary) {
                    if (++n > 10)
                        break;
                    llvm::errs() << "  " << *val << "\n";
                }
                if (SC.secondary.size() >= n) {
                    llvm::errs() << " ... and  " << SC.primary.size() - n + 1
                                 << " more\n";
                }
            }

            if (ssctoall) {
                secondaryToAll.insert(SC.secondary.begin(), SC.secondary.end());
            }
        }
    }

    if (!secondaryToAll.empty()) {
        for (auto &SC : result) {
            if (SC.primary.empty())
                continue;
            SC.secondary.insert(secondaryToAll.begin(), secondaryToAll.end());
        }
    }

    return result;
}